

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O3

void chacha20poly1305_init(ptls_aead_context_t *_ctx,void *iv,void *aad,size_t aadlen)

{
  _func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t **ctx;
  uint8_t tmpbuf [64];
  uint8_t local_78 [4];
  undefined8 local_74;
  undefined4 local_6c;
  uint8_t local_68 [56];
  
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_74 = *iv;
  local_6c = *(undefined4 *)((long)iv + 8);
  cf_chacha20_init_custom
            ((cf_chacha20_ctx *)&_ctx[1].do_encrypt_init,(uint8_t *)(_ctx + 1),0x20,local_78,4);
  cf_chacha20_cipher((cf_chacha20_ctx *)&_ctx[1].do_encrypt_init,"",local_78,0x40);
  ctx = &_ctx[3].do_encrypt_update;
  cf_poly1305_init((cf_poly1305 *)ctx,local_78,local_68);
  (*ptls_clear_memory)(local_78,0x40);
  if (aadlen != 0) {
    cf_poly1305_update((cf_poly1305 *)ctx,(uint8_t *)aad,aadlen);
    if ((aadlen & 0xf) != 0) {
      cf_poly1305_update((cf_poly1305 *)ctx,"",0x10 - (aadlen & 0xf));
    }
  }
  _ctx[6].dispose_crypto = (_func_void_st_ptls_aead_context_t_ptr *)aadlen;
  _ctx[6].do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
  return;
}

Assistant:

static void chacha20poly1305_init(ptls_aead_context_t *_ctx, const void *iv, const void *aad, size_t aadlen)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;
    uint8_t tmpbuf[64];

    /* init chacha */
    memset(tmpbuf, 0, 16 - PTLS_CHACHA20POLY1305_IV_SIZE);
    memcpy(tmpbuf + 16 - PTLS_CHACHA20POLY1305_IV_SIZE, iv, PTLS_CHACHA20POLY1305_IV_SIZE);
    cf_chacha20_init_custom(&ctx->chacha, ctx->key, sizeof(ctx->key), tmpbuf, 4);

    /* init poly1305 (by using first 16 bytes of the key stream of the first block) */
    cf_chacha20_cipher(&ctx->chacha, zeros64, tmpbuf, 64);
    cf_poly1305_init(&ctx->poly, tmpbuf, tmpbuf + 16);

    ptls_clear_memory(tmpbuf, sizeof(tmpbuf));

    /* aad */
    if (aadlen != 0) {
        cf_poly1305_update(&ctx->poly, aad, aadlen);
        chacha20poly1305_encrypt_pad(&ctx->poly, aadlen);
    }

    ctx->aadlen = aadlen;
    ctx->textlen = 0;
}